

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

int get_bool_option(JSContext *ctx,BOOL *pbool,JSValue obj,char *option)

{
  JSValue v;
  JSValue v_00;
  JSValue val_00;
  int iVar1;
  int *in_RSI;
  JSValueUnion in_R8;
  JSValue JVar2;
  JSValue val;
  JSValueUnion ctx_00;
  JSValueUnion JVar3;
  char *in_stack_ffffffffffffffc0;
  JSValueUnion ctx_01;
  JSContext *in_stack_ffffffffffffffc8;
  JSValueUnion JVar4;
  undefined4 local_4;
  
  JVar2.tag = (int64_t)in_RSI;
  JVar2.u.ptr = in_R8.ptr;
  JVar2 = JS_GetPropertyStr(in_stack_ffffffffffffffc8,JVar2,in_stack_ffffffffffffffc0);
  ctx_00 = JVar2.u;
  JVar3 = (JSValueUnion)JVar2.tag;
  ctx_01 = ctx_00;
  JVar4 = JVar3;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    v_00.tag = (int64_t)JVar4.ptr;
    v_00.u.ptr = ctx_01.ptr;
    iVar1 = JS_IsUndefined(v_00);
    if (iVar1 == 0) {
      val_00.tag = (int64_t)in_R8.ptr;
      val_00.u.ptr = JVar4.ptr;
      iVar1 = JS_ToBool((JSContext *)ctx_01.ptr,val_00);
      *in_RSI = iVar1;
    }
    v.tag = (int64_t)ctx_01.ptr;
    v.u.float64 = JVar3.float64;
    JS_FreeValue((JSContext *)ctx_00.ptr,v);
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int get_bool_option(JSContext *ctx, BOOL *pbool,
                           JSValueConst obj,
                           const char *option)
{
    JSValue val;
    val = JS_GetPropertyStr(ctx, obj, option);
    if (JS_IsException(val))
        return -1;
    if (!JS_IsUndefined(val)) {
        *pbool = JS_ToBool(ctx, val);
    }
    JS_FreeValue(ctx, val);
    return 0;
}